

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

void PaUtil_DevicesChanged(uint state,void *pData)

{
  PaUtil_LockHotPlug();
  if (devicesChangedCallback_ != (undefined1 *)0x0) {
    (*(code *)devicesChangedCallback_)(devicesChangedCallbackUserData_);
  }
  PaUtil_UnlockHotPlug();
  return;
}

Assistant:

void PaUtil_DevicesChanged(unsigned state, void* pData)
{
    (void)state;
    (void)pData;
    PaUtil_LockHotPlug();
    if (devicesChangedCallback_)
    {
        (devicesChangedCallback_)(devicesChangedCallbackUserData_);
    }
    PaUtil_UnlockHotPlug();
}